

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

string * google::MakeCheckOpString<google::LogSeverity,int>(LogSeverity *v1,int *v2,char *exprtext)

{
  string *psVar1;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_20;
  
  base::CheckOpMessageBuilder::CheckOpMessageBuilder(&local_20,exprtext);
  std::ostream::operator<<(local_20.stream_,*v1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_20.stream_," vs. ",5);
  std::ostream::operator<<(local_20.stream_,*v2);
  psVar1 = base::CheckOpMessageBuilder::NewString_abi_cxx11_(&local_20);
  base::CheckOpMessageBuilder::~CheckOpMessageBuilder(&local_20);
  return psVar1;
}

Assistant:

std::string* MakeCheckOpString(const T1& v1, const T2& v2,
                               const char* exprtext) {
  base::CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}